

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O0

char * flatcc_json_parser_match_scope(flatcc_json_parser_t *ctx,char *buf,char *end,int pos)

{
  char *mark;
  int pos_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  ctx_local = (flatcc_json_parser_t *)buf;
  if (((long)pos < (long)end - (long)buf) && (buf[pos] == '.')) {
    ctx_local = (flatcc_json_parser_t *)(buf + (long)pos + 1);
  }
  return (char *)ctx_local;
}

Assistant:

static inline const char *flatcc_json_parser_match_scope(flatcc_json_parser_t *ctx, const char *buf, const char *end, int pos)
{
    const char *mark = buf;

    (void)ctx;

    if (end - buf <= pos) {
        return mark;
    }
    if (buf[pos] != '.') {
        return mark;
    }
    return buf + pos + 1;
}